

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.cpp
# Opt level: O2

void unroll(lua_State *L,void *ud)

{
  byte bVar1;
  CallInfo *pCVar2;
  int iVar3;
  
  while (pCVar2 = L->ci, pCVar2 != &L->base_ci) {
    bVar1 = pCVar2->callstatus;
    if ((bVar1 & 1) == 0) {
      if ((pCVar2->nresults == -1) && (pCVar2->top < L->top)) {
        pCVar2->top = L->top;
      }
      if ((bVar1 & 0x20) == 0) {
        (pCVar2->u).c.status = '\x01';
      }
      pCVar2->callstatus = bVar1 & 0xc6 | 8;
      iVar3 = (*(pCVar2->u).c.k)(L);
      luaD_poscall(L,L->top + -(long)iVar3);
    }
    else {
      luaV_finishOp(L);
      luaV_execute(L);
    }
  }
  return;
}

Assistant:

static void unroll (lua_State *L, void *ud) {
  UNUSED(ud);
  for (;;) {
    if (L->ci == &L->base_ci)  /* stack is empty? */
      return;  /* coroutine finished normally */
    if (!isLua(L->ci))  /* C function? */
      finishCcall(L);
    else {  /* Lua function */
      luaV_finishOp(L);  /* finish interrupted instruction */
      luaV_execute(L);  /* execute down to higher C 'boundary' */
    }
  }
}